

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_Mesh::Write(ON_Mesh *this,ON_BinaryArchive *file)

{
  double dVar1;
  double dVar2;
  char cVar3;
  ON__UINT32 OVar4;
  uint uVar5;
  ON_MeshParameters *pOVar6;
  ON_MeshCurvatureStats *pOVar7;
  ON_2dPoint *pOVar8;
  ON_MeshNgon *pOVar9;
  ON_3dPoint *pOVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  endian eVar14;
  ON__UINT32 OVar15;
  ON_V5_MeshDoubleVertices *pOVar16;
  ON__INT32 i;
  uint i_00;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  float fbbox [2] [3];
  float local_58 [8];
  ON_BoundingBox *local_38;
  
  iVar13 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar11 = ON_BinaryArchive::Write3dmChunkVersion(file,3,(uint)(0x3b < iVar13) * 3 + 5);
  OVar15 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  OVar4 = (this->m_F).m_count;
  if (bVar11) {
    bVar11 = ON_BinaryArchive::WriteInt(file,OVar15);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInt(file,OVar4);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x270);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x280);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x240);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x250);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteDouble(file,2,this->m_srf_scale);
  }
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  local_58[2] = 1.0;
  local_58[3] = -1.0;
  local_58[4] = -1.0;
  local_58[5] = -1.0;
  local_38 = &this->m_vertex_bbox;
  bVar12 = ON_BoundingBox::IsNotEmpty(local_38);
  if (bVar12) {
    dVar1 = (this->m_vertex_bbox).m_min.x;
    uVar18 = -(ulong)(dVar1 < 0.0);
    dVar2 = (this->m_vertex_bbox).m_min.y;
    uVar19 = -(ulong)(dVar2 < 0.0);
    local_58[1] = (float)((double)(~uVar19 & 0x3fefffffe0000000 | uVar19 & 0x3ff0000010000000) *
                         dVar2);
    local_58[0] = (float)((double)(~uVar18 & 0x3fefffffe0000000 | uVar18 & 0x3ff0000010000000) *
                         dVar1);
    dVar1 = (this->m_vertex_bbox).m_min.z;
    uVar18 = -(ulong)(dVar1 < 0.0);
    dVar2 = (this->m_vertex_bbox).m_max.x;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = dVar2 * *(double *)(&DAT_006d1120 + (ulong)(0.0 < dVar2) * 8);
    }
    local_58[3] = (float)dVar2;
    local_58[2] = (float)((double)(~uVar18 & 0x3fefffffe0000000 | uVar18 & 0x3ff0000010000000) *
                         dVar1);
    dVar1 = (this->m_vertex_bbox).m_max.y;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar1 = dVar1 * *(double *)(&DAT_006d1120 + (ulong)(0.0 < dVar1) * 8);
    }
    dVar2 = (this->m_vertex_bbox).m_max.z;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = dVar2 * *(double *)(&DAT_006d1120 + (ulong)(0.0 < dVar2) * 8);
    }
    local_58[5] = (float)dVar2;
    local_58[4] = (float)dVar1;
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteFloat(file,6,local_58);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteFloat(file,6,this->m_nbox[0]);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteFloat(file,4,this->m_tbox[0]);
  }
  if (bVar11 != false) {
    cVar3 = this->m_mesh_is_closed;
    i = ((cVar3 == '\x01') - 1) + (uint)(cVar3 == '\x01');
    if (cVar3 == '\x02') {
      i = 0;
    }
    bVar11 = ON_BinaryArchive::WriteInt(file,i);
  }
  pOVar6 = this->m_mesh_parameters;
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteChar(file,pOVar6 != (ON_MeshParameters *)0x0);
  }
  if (((pOVar6 != (ON_MeshParameters *)0x0 & bVar11) == 1) &&
     (bVar11 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0), bVar11)) {
    bVar12 = ON_MeshParameters::Write(this->m_mesh_parameters,file);
    bVar11 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar11 = bVar11 && bVar12;
  }
  if (bVar11 != false) {
    uVar18 = 0;
    do {
      pOVar7 = this->m_kstat[uVar18];
      bVar11 = ON_BinaryArchive::WriteChar(file,pOVar7 != (ON_MeshCurvatureStats *)0x0);
      if ((pOVar7 != (ON_MeshCurvatureStats *)0x0) &&
         (bVar11 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0), bVar11)) {
        bVar12 = ON_MeshCurvatureStats::Write(this->m_kstat[uVar18],file);
        bVar11 = ON_BinaryArchive::EndWrite3dmChunk(file);
        bVar11 = bVar11 && bVar12;
      }
    } while ((bVar11 != false) && (bVar12 = uVar18 < 3, uVar18 = uVar18 + 1, bVar12));
  }
  if (bVar11 != false) {
    bVar11 = WriteFaceArray(this,OVar15,OVar4,file);
  }
  if (bVar11 != false) {
    bVar11 = Write_2(this,OVar15,file);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteInt(file,(uint)this->m_packed_tex_rotate);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteUuid(file,&(this->m_Ttag).m_mapping_id);
  }
  if ((OVar15 != 0) && (bVar11 != false)) {
    OVar4 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
    uVar5 = 0;
    if (OVar15 == OVar4) {
      uVar5 = OVar4;
    }
    eVar14 = ON_BinaryArchive::Endian(file);
    if (eVar14 == big_endian) {
      pOVar8 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar5 * 2),8,pOVar8,pOVar8);
    }
    bVar11 = ON_BinaryArchive::WriteCompressedBuffer
                       (file,(ulong)uVar5 << 4,(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a);
    if (eVar14 == big_endian) {
      pOVar8 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      ON_BinaryArchive::ToggleByteOrder((ulong)(uVar5 * 2),8,pOVar8,pOVar8);
    }
  }
  if (bVar11 != false) {
    bVar11 = ON_MappingTag::Write(&this->m_Ttag,file);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_manifold);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_oriented);
  }
  if (bVar11 != false) {
    bVar11 = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_solid);
  }
  if ((0x3b < iVar13) && (bVar11 != false)) {
    bVar12 = 0 < (this->m_F).m_count;
    bVar17 = (this->m_Ngon).m_count != 0;
    bVar11 = ON_BinaryArchive::WriteBool(file,bVar17 && bVar12);
    if ((bVar17 && bVar12) && bVar11) {
      bVar11 = false;
      bVar12 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
      if (bVar12) {
        uVar5 = (this->m_Ngon).m_count;
        bVar11 = ON_BinaryArchive::WriteInt(file,uVar5);
        uVar18 = 0;
        if (bVar11) {
          if ((ulong)uVar5 != 0) {
            uVar18 = 0;
            do {
              pOVar9 = (this->m_Ngon).m_a[uVar18];
              i_00 = 0;
              if ((((pOVar9 != (ON_MeshNgon *)0x0) && (pOVar9->m_Vcount != 0)) &&
                  (pOVar9->m_Fcount != 0)) &&
                 ((pOVar9->m_vi != (uint *)0x0 && (pOVar9->m_fi != (uint *)0x0)))) {
                i_00 = pOVar9->m_Vcount;
              }
              bVar11 = ON_BinaryArchive::WriteInt(file,i_00);
              if ((!bVar11) ||
                 ((i_00 != 0 &&
                  (((bVar11 = ON_BinaryArchive::WriteInt(file,pOVar9->m_Fcount), !bVar11 ||
                    (bVar11 = ON_BinaryArchive::WriteInt(file,(ulong)i_00,pOVar9->m_vi), !bVar11))
                   || (bVar11 = ON_BinaryArchive::WriteInt
                                          (file,(ulong)pOVar9->m_Fcount,pOVar9->m_fi), !bVar11))))))
              goto LAB_00502856;
              uVar18 = uVar18 + 1;
            } while (uVar5 != uVar18);
            uVar18 = (ulong)uVar5;
          }
LAB_00502856:
          uVar18 = (ulong)((uint)uVar18 == uVar5);
        }
        bVar11 = ON_BinaryArchive::EndWrite3dmChunk(file);
        bVar11 = (bool)(bVar11 & (byte)uVar18);
      }
    }
    if (bVar11 != false) {
      iVar13 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      bVar12 = iVar13 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
      bVar11 = ON_BinaryArchive::WriteBool(file,bVar12 && iVar13 != 0);
      if ((bVar12 && iVar13 != 0) && bVar11) {
        bVar11 = false;
        bVar12 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
        if (bVar12) {
          uVar5 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
          bVar11 = ON_BinaryArchive::WriteInt(file,uVar5);
          if (bVar11) {
            if ((ulong)uVar5 == 0) {
              bVar12 = true;
            }
            else {
              eVar14 = ON_BinaryArchive::Endian(file);
              if (eVar14 == big_endian) {
                pOVar10 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
                ON_BinaryArchive::ToggleByteOrder((ulong)(uVar5 * 3),8,pOVar10,pOVar10);
              }
              bVar12 = ON_BinaryArchive::WriteCompressedBuffer
                                 (file,(ulong)uVar5 * 0x18,
                                  (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
              if (bVar12 && eVar14 == big_endian) {
                pOVar10 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
                ON_BinaryArchive::ToggleByteOrder((ulong)(uVar5 * 3),8,pOVar10,pOVar10);
              }
            }
          }
          else {
            bVar12 = false;
          }
          bVar11 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar11 = (bool)(bVar11 & bVar12);
        }
      }
      if (bVar11 != false) {
        bVar11 = ON_BinaryArchive::WriteBoundingBox(file,local_38);
      }
    }
  }
  if ((((bVar11 != false) && (iVar13 = ON_BinaryArchive::Archive3dmVersion(file), OVar15 != 0)) &&
      (iVar13 == 0x32)) &&
     ((bVar12 = HasSynchronizedDoubleAndSinglePrecisionVertices(this), bVar12 &&
      (pOVar16 = ON_V5_MeshDoubleVertices::AttachV5(this),
      pOVar16 != (ON_V5_MeshDoubleVertices *)0x0)))) {
    ON_3dPointArray::operator=(&pOVar16->m_V5_dV,&this->m_dV);
    iVar13 = (pOVar16->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
    pOVar16->m_dcount = iVar13;
    OVar15 = ON_CRC32(0,(long)iVar13 * 0x18,(pOVar16->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_a)
    ;
    pOVar16->m_dCRC = OVar15;
    iVar13 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    pOVar16->m_fcount = iVar13;
    OVar15 = ON_CRC32(0,(long)iVar13 * 0xc,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
    pOVar16->m_fCRC = OVar15;
  }
  return bVar11;
}

Assistant:

bool ON_Mesh::Write( ON_BinaryArchive& file ) const
{
  int i;
  //const int major_version = 1; // uncompressed
  //const int major_version = 2; // beta format (never used)
  const int major_version = 3; // compressed

  const int minor_version 
    = (file.Archive3dmVersion() >= 60) 
    //? 6  // ngons saved in V6 files as of mid November, 2013
    //? 7  // double precision vertices no longer on user data.
    ? 8  // double precision vertex box
    : 5;

  bool rc = file.Write3dmChunkVersion(major_version,minor_version);

  const unsigned int vcount = VertexUnsignedCount();
  const unsigned int fcount = FaceUnsignedCount();

  if (rc) rc = file.WriteInt( vcount );
  if (rc) rc = file.WriteInt( fcount );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[0] );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[1] );
  if (rc) rc = file.WriteInterval( m_srf_domain[0] );
  if (rc) rc = file.WriteInterval( m_srf_domain[1] );
  if (rc) rc = file.WriteDouble( 2, m_srf_scale );

  // legacy float precision vertex bounding box
  float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
  if (m_vertex_bbox.IsNotEmpty())
  {
    fbbox[0][0] = ON_FloatFloor(m_vertex_bbox.m_min.x);
    fbbox[0][1] = ON_FloatFloor(m_vertex_bbox.m_min.y);
    fbbox[0][2] = ON_FloatFloor(m_vertex_bbox.m_min.z);
    fbbox[1][0] = ON_FloatCeil(m_vertex_bbox.m_max.x);
    fbbox[1][1] = ON_FloatCeil(m_vertex_bbox.m_max.y);
    fbbox[1][2] = ON_FloatCeil(m_vertex_bbox.m_max.z);
  }
  if (rc) rc = file.WriteFloat( 6, &fbbox[0][0] );

  if (rc) rc = file.WriteFloat( 6, &m_nbox[0][0] );
  if (rc) rc = file.WriteFloat( 4, &m_tbox[0][0] );

  // archive int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
  i = -1;
  switch( m_mesh_is_closed )
  {
  case 0: // unset
    i = -1;
    break;
  case 1: // closed
    i = 1;
    break;
  case 2: // not closed
    i = 0;
    break;
  }
  if (rc) rc = file.WriteInt( i );

  unsigned char b = m_mesh_parameters ? 1 : 0;
  if (rc) rc = file.WriteChar(b);
  if (rc && b) {
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if (rc) {
      rc = m_mesh_parameters->Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  for ( i = 0; rc && i < 4; i++ ) {
    b = m_kstat[i] ? 1 : 0;
    rc = file.WriteChar(b);
    if (b) {
      rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
      if (rc) {
        rc = m_kstat[i]->Write(file);
        if ( !file.EndWrite3dmChunk() )
          rc = false;
      }
    }
  }

  if (rc) rc = WriteFaceArray( vcount, fcount, file );

  if (rc) {
    // major version is a hard coded 3

    //if ( major_version == 1 )
    //  rc = Write_1(file);
    //else if ( major_version == 3 )
      rc = Write_2(vcount,file);
    //else
    //  rc = false;
  }

  // added for minor version 1.2 and 3.2
  i = m_packed_tex_rotate ? 1 : 0;
  if (rc) rc = file.WriteInt( i );

  // added for minor version 3.3
  if (rc) rc = file.WriteUuid( m_Ttag.m_mapping_id );
 
  // compressed m_S[]
  if ( rc && vcount > 0U ) 
  {
    // Before 201011049 there was a bug that let m_S[] arrays
    // with the wrong size get saved in files. 
    const unsigned int Scount = (vcount == m_S.UnsignedCount()) ? m_S.UnsignedCount() : 0;
    const ON::endian e = file.Endian();
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
    if (rc) rc = file.WriteCompressedBuffer( Scount*sizeof(ON_2dPoint),m_S.Array() );
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
  }

  // added for minor version 3.4
  if (rc) rc = m_Ttag.Write(file);

  // added for minor version 3.5
  if (rc) rc = file.WriteChar( m_mesh_is_manifold );
  if (rc) rc = file.WriteChar( m_mesh_is_oriented );
  if (rc) rc = file.WriteChar( m_mesh_is_solid );


  if ( rc && minor_version >= 6 )
  {
    // added n-gons version 3.6
    bool bHasNgons = HasNgons();    
    rc =  file.WriteBool(bHasNgons);
    if (rc && bHasNgons)
      rc = WriteMeshNgons(file,m_Ngon);

    if (rc && minor_version >= 7)
    {
      // added explicit double precision vertices chunk version 3.7
      // (used to be on user data)
      const bool bHasDoublePrecisionVertices = HasDoublePrecisionVertices();
      if (rc) rc = file.WriteBool(bHasDoublePrecisionVertices);
      if (rc && bHasDoublePrecisionVertices)
        rc = WriteMeshDoublePrecisionVertices(file, m_dV);

      if (rc && minor_version >= 8)
      {
        rc = file.WriteBoundingBox(m_vertex_bbox);
      }
    }
  }
  
  
  if (rc 
    && 50 == file.Archive3dmVersion() 
    && vcount > 0 
    && HasSynchronizedDoubleAndSinglePrecisionVertices() 
    )
  {
    // save double precision vertices using V5 user data.
    ON_V5_MeshDoubleVertices* ud = ON_V5_MeshDoubleVertices::AttachV5(this);
    if (nullptr != ud)
    {
      ud->m_V5_dV = m_dV;
      ud->m_dcount = ud->m_V5_dV.UnsignedCount();
      ud->m_dCRC = ud->DoubleCRC();
      ud->m_fcount = m_V.UnsignedCount();
      ud->m_fCRC = ON_V5_MeshDoubleVertices::FloatCRC(m_V);
      // This obsolete user data will be deleted after it is written to the V5 .3dm file.
    }
  }

  return rc;
}